

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dirtyudp.h
# Opt level: O3

void __thiscall UdpSender::UdpSender(UdpSender *this,char *host,int port,int bufferSize)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  hostent *phVar5;
  void *pvVar6;
  uint extraout_EDX;
  UdpSender *this_00;
  char **this_01;
  UdpReceiver *this_02;
  anon_class_16_2_8a47e332_for_handler_ aStack_38;
  char **ppcStack_28;
  
  this->host = host;
  this->port = port;
  this->bufferSize = bufferSize;
  pcVar4 = (char *)calloc((long)bufferSize,1);
  this->buffer = pcVar4;
  this_00 = (UdpSender *)0x2;
  uVar3 = 2;
  iVar2 = socket(2,2,0);
  this->socketFile = iVar2;
  if (iVar2 < 0) {
    UdpSender(this_00);
  }
  else {
    phVar5 = gethostbyname(this->host);
    this->server = (hostent *)phVar5;
    if (phVar5 != (hostent *)0x0) {
      (this->serverAddress).sin_family = 0;
      (this->serverAddress).sin_port = 0;
      (this->serverAddress).sin_addr = 0;
      (this->serverAddress).sin_zero[0] = '\0';
      (this->serverAddress).sin_zero[1] = '\0';
      (this->serverAddress).sin_zero[2] = '\0';
      (this->serverAddress).sin_zero[3] = '\0';
      (this->serverAddress).sin_zero[4] = '\0';
      (this->serverAddress).sin_zero[5] = '\0';
      (this->serverAddress).sin_zero[6] = '\0';
      (this->serverAddress).sin_zero[7] = '\0';
      (this->serverAddress).sin_family = 2;
      memmove(&(this->serverAddress).sin_addr,*phVar5->h_addr_list,(long)phVar5->h_length);
      uVar1 = (ushort)this->port;
      (this->serverAddress).sin_port = uVar1 << 8 | uVar1 >> 8;
      return;
    }
  }
  this_01 = &this->host;
  UdpSender((UdpSender *)this_01);
  *(uint *)((long)this_01 + 4) = uVar3;
  ((sockaddr_in *)(this_01 + 1))->sin_family = (short)extraout_EDX;
  ((sockaddr_in *)(this_01 + 1))->sin_port = (short)(extraout_EDX >> 0x10);
  pvVar6 = calloc((long)(int)extraout_EDX,1);
  this_01[2] = (char *)pvVar6;
  this_02 = (UdpReceiver *)0x2;
  uVar3 = socket(2,2,0);
  *(uint *)this_01 = uVar3;
  if ((int)uVar3 < 0) {
    UdpReceiver::UdpReceiver(this_02);
  }
  else {
    ((in_addr *)((long)this_01 + 0xc))->s_addr = 1;
    setsockopt(uVar3,1,6,(in_addr *)((long)this_01 + 0xc),4);
    *(uint *)((long)(this_01 + 5) + 0) = 0;
    *(uint *)((long)(this_01 + 5) + 4) = 0;
    *(undefined2 *)(this_01 + 4) = 2;
    *(uint *)((long)this_01 + 0x24) = 0;
    *(ushort *)((long)this_01 + 0x22) =
         *(ushort *)((long)this_01 + 4) << 8 | *(ushort *)((long)this_01 + 4) >> 8;
    this_02 = (UdpReceiver *)(ulong)*(uint *)this_01;
    iVar2 = bind(*(uint *)this_01,(sockaddr *)(this_01 + 4),0x10);
    if (-1 < iVar2) {
      *(uint *)(this_01 + 9) = 0x10;
      return;
    }
  }
  UdpReceiver::UdpReceiver(this_02);
  *(undefined1 *)&this_02->socketFile = 1;
  ppcStack_28 = this_01;
  ableton::Link::Link((Link *)&this_02->bufferSize,120.0);
  LOCK();
  iVar2 = this_02[5].socketFile;
  *(undefined1 *)&this_02[5].socketFile = 1;
  UNLOCK();
  if ((iVar2 & 1) == 0) {
    aStack_38.this =
         (Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
          *)this_02[1].serverAddress.sin_zero;
    aStack_38.bEnable = true;
    asio::io_context::
    post<ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::enable(bool)::_lambda()_1_>
              (*(io_context **)&this_02[5].bufferSize,&aStack_38);
  }
  this_02[0x11].clientIP = (char *)0x4010000000000000;
  return;
}

Assistant:

UdpSender(char* host, int port, int bufferSize) {
      this->host = host;
      this->port = port;
      this->bufferSize = bufferSize;
      this->buffer = (char*)calloc(this->bufferSize, sizeof(char));
      // create socket
      this->socketFile = socket(AF_INET, SOCK_DGRAM, 0);
      if(this->socketFile < 0) error("ERROR: Could not open socket\n");
      // get DNS entry for server
      this->server = gethostbyname(this->host);
      if(this->server == NULL) {
        fprintf(stderr, "ERROR: Could not find host %s\n", this->host);
        exit(0);
      }
      // construct server address
      bzero((char*)&this->serverAddress, sizeof(this->serverAddress));
      this->serverAddress.sin_family = AF_INET;
      bcopy((char*)this->server->h_addr,
            (char*)&this->serverAddress.sin_addr.s_addr,
            this->server->h_length);
      this->serverAddress.sin_port = htons(this->port);
    }